

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O3

void __thiscall HDual::rp_hsol_pv_c(HDual *this,HVector *column)

{
  pointer pdVar1;
  int iVar2;
  ulong uVar3;
  
  if (0x14 < this->numCol) {
    return;
  }
  pdVar1 = (column->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  printf("\nPvC: %2d  \n",(ulong)(uint)this->columnIn);
  iVar2 = this->numRow;
  if (0 < iVar2) {
    uVar3 = 0;
    do {
      if (0.001 < ABS(pdVar1[uVar3])) {
        printf(" %2d: %4.1g\n",uVar3 & 0xffffffff);
        iVar2 = this->numRow;
      }
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)iVar2);
  }
  putchar(10);
  return;
}

Assistant:

void HDual::rp_hsol_pv_c(HVector *column) const {
  const double *columnArray = &column->array[0];
  // Alias
  //Set limits on problem size for reporting
  //	const int mx_rp_numTot = 20;
  if (numCol > mx_rp_numTot)
    return;
  printf("\nPvC: %2d  \n", columnIn);
  for (int i = 0; i < numRow; i++) {
    if (abs(columnArray[i]) > 1e-3)
      printf(" %2d: %4.1g\n", i, columnArray[i]);
  }
  printf("\n");
}